

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::DoParseJson(Parser *this)

{
  bool bVar1;
  SizeT SVar2;
  long lVar3;
  StructDef *in_RSI;
  char *local_e8;
  char *local_d8;
  Offset<flatbuffers::Table> local_8c;
  Offset<flatbuffers::Table> local_88;
  byte local_81;
  offset_type local_80;
  allocator<char> local_79;
  uoffset_t toff;
  allocator<char> local_51;
  string local_50 [32];
  uint local_30;
  byte local_19;
  Parser *this_local;
  CheckedError *ce;
  
  this_local = this;
  if (*(int *)((long)&(in_RSI->super_Definition).name.field_2 + 0xc) == 0x7b) {
    if (*(_Base_ptr *)
         ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                 _M_header + 8) == (_Base_ptr)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,"no root type set to parse json with",&local_51);
      Error(this,(string *)in_RSI);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
      goto LAB_0014933f;
    }
    SVar2 = FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)
                       &in_RSI[1].super_Definition.attributes.dict._M_t._M_impl.
                        super__Rb_tree_header._M_node_count);
    if (SVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&toff,"cannot have more than one json object in a file",&local_79);
      Error(this,(string *)in_RSI);
      std::__cxx11::string::~string((string *)&toff);
      std::allocator<char>::~allocator(&local_79);
      goto LAB_0014933f;
    }
    local_81 = 0;
    ParseTable(this,in_RSI,
               (string *)
               *(_Base_ptr *)
                ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.
                        super__Rb_tree_header._M_header + 8),(uoffset_t *)0x0);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) {
      local_81 = 1;
    }
    local_30 = (uint)bVar1;
    if ((local_81 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_30 != 0) goto LAB_0014933f;
    if ((in_RSI[4].super_Definition.file._M_string_length & 0x100) == 0) {
      Offset<flatbuffers::Table>::Offset(&local_8c,local_80);
      lVar3 = std::__cxx11::string::length();
      if (lVar3 == 0) {
        local_e8 = (char *)0x0;
      }
      else {
        local_e8 = (char *)std::__cxx11::string::c_str();
      }
      FlatBufferBuilderImpl<false>::Finish<flatbuffers::Table>
                ((FlatBufferBuilderImpl<false> *)
                 &in_RSI[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,local_8c,local_e8);
    }
    else {
      Offset<flatbuffers::Table>::Offset(&local_88,local_80);
      lVar3 = std::__cxx11::string::length();
      if (lVar3 == 0) {
        local_d8 = (char *)0x0;
      }
      else {
        local_d8 = (char *)std::__cxx11::string::c_str();
      }
      FlatBufferBuilderImpl<false>::FinishSizePrefixed<flatbuffers::Table>
                ((FlatBufferBuilderImpl<false> *)
                 &in_RSI[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,local_88,local_d8);
    }
  }
  else {
    local_19 = 0;
    Expect(this,(int)in_RSI);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) {
      local_19 = 1;
    }
    local_30 = (uint)bVar1;
    if ((local_19 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_30 != 0) goto LAB_0014933f;
  }
  if (((ulong)in_RSI[4].original_location._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl & 1) != 0) {
    Expect(this,(int)in_RSI);
    bVar1 = CheckedError::Check((CheckedError *)this);
    local_30 = (uint)bVar1;
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_30 != 0) goto LAB_0014933f;
  }
  anon_unknown_0::NoError();
LAB_0014933f:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::DoParseJson() {
  if (token_ != '{') {
    EXPECT('{');
  } else {
    if (!root_struct_def_) return Error("no root type set to parse json with");
    if (builder_.GetSize()) {
      return Error("cannot have more than one json object in a file");
    }
    uoffset_t toff;
    ECHECK(ParseTable(*root_struct_def_, nullptr, &toff));
    if (opts.size_prefixed) {
      builder_.FinishSizePrefixed(
          Offset<Table>(toff),
          file_identifier_.length() ? file_identifier_.c_str() : nullptr);
    } else {
      builder_.Finish(Offset<Table>(toff), file_identifier_.length()
                                               ? file_identifier_.c_str()
                                               : nullptr);
    }
  }
  if (opts.require_json_eof) {
    // Check that JSON file doesn't contain more objects or IDL directives.
    // Comments after JSON are allowed.
    EXPECT(kTokenEof);
  }
  return NoError();
}